

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

void IOcontroller::write_budget_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  char *pcVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  const_reference pvVar5;
  int local_554;
  undefined1 local_550 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  ostream local_4f0 [8];
  ofstream outFile_inf_cost;
  int local_2ec;
  undefined1 local_2e8 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ostream local_288 [8];
  ofstream outFile_inf;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  undefined1 local_58 [8];
  Nodelist vecSeed_inf_cost;
  Nodelist vecSeed_inf;
  Graph *graph_local;
  string *outFolder_local;
  TResult *resultObj_local;
  string *outFileName_local;
  
  ResultInfo::get_seed_inf_vec
            ((Nodelist *)
             &vecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,resultObj);
  ResultInfo::get_seed_inf_cost_vec((Nodelist *)local_58,resultObj);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  mkdir_absence(pcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 outFolder,"/seed");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  mkdir_absence(pcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "/seed_");
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 outFileName);
  std::operator+(&local_2a8,&local_2c8,"_inf");
  std::ofstream::ofstream(local_288,(string *)&local_2a8,_S_out);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_2e8);
  local_2ec = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vecSeed_inf_cost.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= (ulong)(long)local_2ec) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &vecSeed_inf_cost.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_2ec);
    poVar4 = (ostream *)std::ostream::operator<<(local_288,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    pvVar5 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::operator[](graph,(long)local_2ec);
    sVar2 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(pvVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::operator<<(poVar4,'\n');
    local_2ec = local_2ec + 1;
  }
  std::ofstream::close();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "/seed_");
  std::operator+(&local_530,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
                 outFileName);
  std::operator+(&local_510,&local_530,"_inf_cost");
  std::ofstream::ofstream(local_4f0,(string *)&local_510,_S_out);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_550);
  local_554 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    if (sVar2 <= (ulong)(long)local_554) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                        (long)local_554);
    poVar4 = (ostream *)std::ostream::operator<<(local_4f0,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    pvVar5 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::operator[](graph,(long)local_554);
    sVar2 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(pvVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::operator<<(poVar4,'\n');
    local_554 = local_554 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_4f0);
  std::ofstream::~ofstream(local_288);
  std::__cxx11::string::~string((string *)local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void write_budget_order_seeds(const std::string & outFileName, const TResult & resultObj,
            const std::string & outFolder, const Graph & graph) {
        auto vecSeed_inf = resultObj.get_seed_inf_vec();
        auto vecSeed_inf_cost = resultObj.get_seed_inf_cost_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile_inf(outpath + "/seed_" + outFileName + "_inf");
        for (auto i = 0; i < vecSeed_inf.size(); i++)
        {
            outFile_inf << vecSeed_inf[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf.close();
        std::ofstream outFile_inf_cost(outpath + "/seed_" + outFileName + "_inf_cost");
        for (auto i = 0; i < vecSeed_inf_cost.size(); i++)
        {
            outFile_inf_cost << vecSeed_inf_cost[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf_cost.close();
    }